

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall
cppforth::Forth::ForthStack<unsigned_int>::setTop
          (ForthStack<unsigned_int> *this,size_t index,uint Value)

{
  reference pvVar1;
  AbortException *this_00;
  size_type __n;
  
  __n = this->top - index;
  if (__n < (ulong)((long)(this->stack).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->stack).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2)) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->stack,__n);
    *pvVar1 = Value;
    return;
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  AbortException::AbortException(this_00,"Forth stack overflow");
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void setTop(size_t index, CellType Value){

				{auto index1 = top - index;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(top - index) = Value;
			}